

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O1

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<int>::Visit
          (PrecomputeVisitor<int> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  pointer psVar1;
  pointer psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  local_88;
  undefined1 local_68 [16];
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  local_58;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (pointer)op;
  (*(((op->super___shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ->super_Operator)._vptr_Operator[1])(&local_88);
  psVar1 = local_88.
           super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_88.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_88.
             super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      (**(code **)*p_Var3->_vptr__Sp_counted_base)(p_Var3->_vptr__Sp_counted_base,this);
      local_68._0_8_ =
           (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_68._8_8_ =
           (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>
      ::emplace_back<std::shared_ptr<calc4::Operator_const>>
                ((vector<std::shared_ptr<calc4::Operator_const>,std::allocator<std::shared_ptr<calc4::Operator_const>>>
                  *)&local_58,(shared_ptr<const_calc4::Operator> *)local_68);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
      }
      p_Var3 = p_Var3 + 1;
    } while (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1);
  }
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(&local_88);
  UserDefinedOperator::Create
            ((UserDefinedOperator *)&local_88,
             &((__shared_ptr<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2> *)
              &local_38->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)->
              _M_ptr->definition,&local_58,(optional<bool>)0x0);
  psVar2 = local_88.
           super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar1 = local_88.
           super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var3 = (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)psVar1;
  (this->value).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar2;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if ((element_type *)
      local_88.
      super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.
               super__Vector_base<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        std::vector<std::shared_ptr<const Operator>> operands;

        for (auto& op2 : op->GetOperands())
        {
            operands.push_back(Precompute(op2));
        }

        value = UserDefinedOperator::Create(op->GetDefinition(), std::move(operands));
    }